

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::DummyDataParameter::DummyDataParameter(DummyDataParameter *this)

{
  DummyDataParameter *pDVar1;
  DummyDataParameter *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DummyDataParameter_00d4eb50;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  google::protobuf::RepeatedPtrField<caffe::FillerParameter>::RepeatedPtrField(&this->data_filler_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->num_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->channels_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->height_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->width_);
  google::protobuf::RepeatedPtrField<caffe::BlobShape>::RepeatedPtrField(&this->shape_);
  pDVar1 = internal_default_instance();
  if (this != pDVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

DummyDataParameter::DummyDataParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.DummyDataParameter)
}